

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void SolveLDLT(Matrix *l,Matrix *d,Matrix *b)

{
  ostream *poVar1;
  Matrix y;
  Matrix z;
  LinearSystem y_solver;
  LinearSystem solver;
  LinearSystem z_solver;
  Matrix local_420;
  Matrix local_400;
  Matrix local_3e0;
  LinearSystem local_3c0;
  LinearSystem local_288;
  LinearSystem local_150;
  
  LinearSystem::LinearSystem(&local_150,l,b,Standard);
  LinearSystem::RunGauss(&local_150,Without);
  poVar1 = operator<<((ostream *)&Options::writer_abi_cxx11_,&local_150);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  LinearSystem::GetSolutionMatrix(&local_3e0,&local_150);
  LinearSystem::LinearSystem(&local_3c0,d,&local_3e0,Standard);
  LinearSystem::RunGauss(&local_3c0,Without);
  poVar1 = operator<<((ostream *)&Options::writer_abi_cxx11_,&local_3c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  LinearSystem::GetSolutionMatrix(&local_400,&local_3c0);
  Matrix::GetTranspose(&local_420,l);
  LinearSystem::LinearSystem(&local_288,&local_420,&local_400,Standard);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_420.elements_);
  LinearSystem::RunGauss(&local_288,Without);
  poVar1 = operator<<((ostream *)&Options::writer_abi_cxx11_,&local_288);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  LinearSystem::~LinearSystem(&local_288);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_400.elements_);
  LinearSystem::~LinearSystem(&local_3c0);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_3e0.elements_);
  LinearSystem::~LinearSystem(&local_150);
  return;
}

Assistant:

void SolveLDLT(const Matrix& l, const Matrix& d, const Matrix& b) {
    LinearSystem z_solver(l, b);
    z_solver.RunGauss(Options::ChoiceType::Without);
    Options::writer << z_solver << std::endl;
    Matrix z = z_solver.GetSolutionMatrix();

    LinearSystem y_solver(d, z);
    y_solver.RunGauss(Options::ChoiceType::Without);
    Options::writer << y_solver << std::endl;
    Matrix y = y_solver.GetSolutionMatrix();

    LinearSystem solver(l.GetTranspose(), y);
    solver.RunGauss(Options::ChoiceType::Without);
    Options::writer << solver << std::endl;
}